

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.c
# Opt level: O0

void copy_action(void)

{
  int lineno;
  char *pcVar1;
  bool bVar2;
  FILE *__stream;
  bucket **ppbVar3;
  int i_00;
  int iVar4;
  char *line;
  char *pcVar5;
  union_tag *puVar6;
  ushort **ppuVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  bool bVar11;
  char *local_98;
  char *local_90;
  char *arg_1;
  char *arg;
  char *d_cptr;
  char *d_line;
  int d_lineno;
  bucket **rhs;
  char *pcStack_50;
  Yshort maxoffset;
  Yshort *offsets;
  char *a_cptr;
  char *a_line;
  int a_lineno;
  FILE *f;
  char *tag;
  int haveyyval;
  int depth;
  int n;
  int j;
  int i;
  int c;
  
  __stream = action_file;
  bVar2 = false;
  lineno = input_file->lineno;
  line = dup_line();
  lVar8 = (long)cptr - (long)::line;
  pcStack_50 = (char *)0x0;
  if (last_was_action != '\0') {
    insert_empty_rule();
  }
  last_was_action = '\x01';
  trialaction = *cptr == '[';
  fprintf((FILE *)__stream,"case %d:\n",(ulong)(nrules - 2));
  if (trialaction == '\0') {
    fprintf((FILE *)__stream,"  if (!%strial)\n",symbol_prefix);
  }
  if (lflag == '\0') {
    fprintf((FILE *)__stream,line_format,(ulong)(uint)input_file->lineno,input_file->name);
  }
  if (*cptr == '=') {
    cptr = cptr + 1;
  }
  haveyyval = 0;
  rhs._4_4_ = 0;
  iVar4 = nitems;
  while (n = iVar4 + -1, pitem[n] != (bucket *)0x0) {
    haveyyval = haveyyval + 1;
    iVar4 = n;
    if (pitem[n]->class != '\x04') {
      rhs._4_4_ = rhs._4_4_ + 1;
    }
  }
  if ((0 < rhs._4_4_) && (pcStack_50 = allocate((rhs._4_4_ + 1) * 4), pcStack_50 == (char *)0x0)) {
    no_space();
  }
  depth = 0;
  for (n = iVar4; ppbVar3 = pitem, n < nitems; n = n + 1) {
    if (pitem[n]->class != '\x04') {
      depth = depth + 1;
      *(int *)(pcStack_50 + (long)depth * 4) = (n - nitems) + 1;
    }
  }
  lVar9 = (long)nitems;
  tag._4_4_ = 0;
LAB_0011a22e:
  j = (int)*cptr;
  if (j == 0x24) {
    if (cptr[1] == '<') {
      iVar4 = input_file->lineno;
      pcVar5 = dup_line();
      lVar10 = (long)cptr - (long)::line;
      cptr = cptr + 1;
      puVar6 = get_tag(1);
      pcVar1 = puVar6->name;
      j = (int)*cptr;
      if (j == 0x24) {
        fprintf((FILE *)__stream,"%sval.%s",symbol_prefix,pcVar1);
        cptr = cptr + 1;
        free(pcVar5);
        goto LAB_0011a22e;
      }
      ppuVar7 = __ctype_b_loc();
      if (((*ppuVar7)[j] & 0x800) != 0) {
        i_00 = get_number();
        if (rhs._4_4_ < i_00) {
          dollar_warning(iVar4,i_00);
          fprintf((FILE *)__stream,"%svsp[%d].%s",symbol_prefix,(ulong)(uint)(i_00 - rhs._4_4_),
                  pcVar1);
        }
        else {
          fprintf((FILE *)__stream,"%svsp[%d].%s",symbol_prefix,
                  (ulong)*(uint *)(pcStack_50 + (long)i_00 * 4),pcVar1);
        }
        free(pcVar5);
        goto LAB_0011a22e;
      }
      if ((j == 0x2d) && (ppuVar7 = __ctype_b_loc(), ((*ppuVar7)[(int)cptr[1]] & 0x800) != 0)) {
        cptr = cptr + 1;
        iVar4 = get_number();
        fprintf((FILE *)__stream,"%svsp[%d].%s",symbol_prefix,(ulong)(uint)(-haveyyval - iVar4),
                pcVar1);
        free(pcVar5);
        goto LAB_0011a22e;
      }
      ppuVar7 = __ctype_b_loc();
      if ((((*ppuVar7)[j] & 0x400) != 0) || (j == 0x5f)) {
        puVar6 = get_tag(0);
        n = plhs[nrules]->args;
        do {
          n = n + -1;
          if (n < 0) break;
        } while (puVar6->name != plhs[nrules]->argnames[n]);
        if (n < 0) {
          error(iVar4,pcVar5,pcVar5 + lVar10,"unknown argument %s",puVar6->name);
        }
        fprintf((FILE *)__stream,"%svsp[%d].%s",symbol_prefix,
                (ulong)(uint)(((n - plhs[nrules]->args) + 1) - haveyyval),pcVar1);
        free(pcVar5);
        goto LAB_0011a22e;
      }
      dollar_error(iVar4,pcVar5,pcVar5 + lVar10);
    }
    else {
      if (cptr[1] == '$') {
        if (havetags == 0) {
          fprintf((FILE *)__stream,"%sval",symbol_prefix);
        }
        else {
          if (plhs[nrules]->tag == (union_tag *)0x0) {
            local_90 = (char *)0x0;
          }
          else {
            local_90 = plhs[nrules]->tag->name;
          }
          if (local_90 == (char *)0x0) {
            untyped_lhs();
          }
          fprintf((FILE *)__stream,"%sval.%s",symbol_prefix,local_90);
        }
        cptr = cptr + 2;
        bVar2 = true;
        goto LAB_0011a22e;
      }
      ppuVar7 = __ctype_b_loc();
      if (((*ppuVar7)[(int)cptr[1]] & 0x800) != 0) {
        cptr = cptr + 1;
        iVar4 = get_number();
        if (havetags == 0) {
          if (haveyyval < iVar4) {
            dollar_warning(input_file->lineno,iVar4);
            fprintf((FILE *)__stream,"%svsp[%d]",symbol_prefix,(ulong)(uint)(iVar4 - rhs._4_4_));
          }
          else {
            fprintf((FILE *)__stream,"%svsp[%d]",symbol_prefix,
                    (ulong)*(uint *)(pcStack_50 + (long)iVar4 * 4));
          }
        }
        else {
          if ((iVar4 < 1) || (rhs._4_4_ < iVar4)) {
            unknown_rhs(iVar4);
          }
          if (ppbVar3[lVar9 + (long)*(int *)(pcStack_50 + (long)iVar4 * 4) + -1]->tag ==
              (union_tag *)0x0) {
            local_98 = (char *)0x0;
          }
          else {
            local_98 = ppbVar3[lVar9 + (long)*(int *)(pcStack_50 + (long)iVar4 * 4) + -1]->tag->name
            ;
          }
          if (local_98 == (char *)0x0) {
            untyped_rhs(iVar4,ppbVar3[lVar9 + (long)*(int *)(pcStack_50 + (long)iVar4 * 4) + -1]->
                              name);
          }
          fprintf((FILE *)__stream,"%svsp[%d].%s",symbol_prefix,
                  (ulong)*(uint *)(pcStack_50 + (long)iVar4 * 4),local_98);
        }
        goto LAB_0011a22e;
      }
      if (cptr[1] == '-') {
        cptr = cptr + 2;
        iVar4 = get_number();
        if (havetags != 0) {
          unknown_rhs(-iVar4);
        }
        fprintf((FILE *)__stream,"%svsp[%d]",symbol_prefix,(ulong)(uint)(-haveyyval - iVar4));
        goto LAB_0011a22e;
      }
      ppuVar7 = __ctype_b_loc();
      if ((((*ppuVar7)[(int)cptr[1]] & 0x400) != 0) || (cptr[1] == '_')) {
        cptr = cptr + 1;
        puVar6 = get_tag(0);
        pcVar1 = puVar6->name;
        n = plhs[nrules]->args;
        do {
          n = n + -1;
          if (n < 0) break;
        } while (pcVar1 != plhs[nrules]->argnames[n]);
        if (n < 0) {
          error(input_file->lineno,::line,cptr,"unknown argument %s",pcVar1);
        }
        pcVar5 = plhs[nrules]->argtags[n];
        fprintf((FILE *)__stream,"%svsp[%d]",symbol_prefix,
                (ulong)(uint)(((n - plhs[nrules]->args) + 1) - haveyyval));
        if (pcVar5 == (char *)0x0) {
          if (havetags != 0) {
            error(input_file->lineno,(char *)0x0,(char *)0x0,"untyped argument $%s",pcVar1);
          }
        }
        else {
          fprintf((FILE *)__stream,".%s",pcVar5);
        }
        goto LAB_0011a22e;
      }
    }
  }
  else if (j == 0x40) {
    if ((cptr[1] == '@') || (cptr[1] == '$')) {
      fprintf((FILE *)__stream,"%spos",symbol_prefix);
      cptr = cptr + 2;
      goto LAB_0011a22e;
    }
    ppuVar7 = __ctype_b_loc();
    if (((*ppuVar7)[(int)cptr[1]] & 0x800) != 0) {
      cptr = cptr + 1;
      iVar4 = get_number();
      if (haveyyval < iVar4) {
        at_warning(input_file->lineno,iVar4);
        fprintf((FILE *)__stream,"%spsp[%d]",symbol_prefix,(ulong)(uint)(iVar4 - rhs._4_4_));
      }
      else {
        fprintf((FILE *)__stream,"%spsp[%d]",symbol_prefix,
                (ulong)*(uint *)(pcStack_50 + (long)iVar4 * 4));
      }
      goto LAB_0011a22e;
    }
    if (cptr[1] == '-') {
      cptr = cptr + 2;
      iVar4 = get_number();
      fprintf((FILE *)__stream,"%spsp[%d]",symbol_prefix,(ulong)(uint)(-haveyyval - iVar4));
      goto LAB_0011a22e;
    }
  }
  ppuVar7 = __ctype_b_loc();
  if (((((*ppuVar7)[j] & 0x400) == 0) && (j != 0x5f)) && (j != 0x24)) {
    cptr = cptr + 1;
    if (((trialaction != '\0') && (j == 0x5b)) && (tag._4_4_ == 0)) {
      tag._4_4_ = 1;
      putc(0x7b,(FILE *)__stream);
      goto LAB_0011a22e;
    }
    if (((trialaction != '\0') && (j == 0x5d)) && (tag._4_4_ == 1)) {
      tag._4_4_ = 0;
      putc(0x7d,(FILE *)__stream);
      iVar4 = nextc();
      if ((iVar4 != 0x5b) || (bVar2)) {
        if ((iVar4 != 0x7b) || (bVar2)) {
          fprintf((FILE *)__stream,"\n");
          if (lflag == '\0') {
            fprintf((FILE *)__stream,"#\n");
          }
          fprintf((FILE *)__stream,"break;\n");
          free(line);
          if (rhs._4_4_ < 1) {
            return;
          }
          free(pcStack_50);
          return;
        }
        fprintf((FILE *)__stream,"\n");
        if (lflag == '\0') {
          fprintf((FILE *)__stream,"#\n");
        }
        fprintf((FILE *)__stream,"  if (!%strial)\n",symbol_prefix);
        if (lflag == '\0') {
          fprintf((FILE *)__stream,line_format,(ulong)(uint)input_file->lineno,input_file->name);
        }
        trialaction = '\0';
      }
      goto LAB_0011a22e;
    }
    putc(j,(FILE *)__stream);
    if (j == 10) {
      get_line();
      if (::line != (char *)0x0) goto LAB_0011a22e;
      unterminated_action(lineno,line,line + lVar8);
    }
    else {
      if ((j == 0x22) || (j == 0x27)) {
        copy_string(j,__stream,(FILE *)0x0);
        goto LAB_0011a22e;
      }
      if (j == 0x2f) {
        copy_comment(__stream,(FILE *)0x0);
        goto LAB_0011a22e;
      }
      if (j != 0x3b) {
        if (j == 0x5b) {
          tag._4_4_ = tag._4_4_ + 1;
        }
        else if (j == 0x5d) {
          tag._4_4_ = tag._4_4_ + -1;
        }
        else if (j == 0x7b) {
          tag._4_4_ = tag._4_4_ + 1;
        }
        else if ((j == 0x7d) && (tag._4_4_ = tag._4_4_ + -1, tag._4_4_ < 1)) {
          iVar4 = nextc();
          if ((iVar4 != 0x5b) || (bVar2)) {
            if ((iVar4 != 0x7b) || (bVar2)) {
              fprintf((FILE *)__stream,"\n");
              if (lflag == '\0') {
                fprintf((FILE *)__stream,"#\n");
              }
              fprintf((FILE *)__stream,"break;\n");
              free(line);
              if (rhs._4_4_ < 1) {
                return;
              }
              free(pcStack_50);
              return;
            }
            fprintf((FILE *)__stream,"\n");
            if (lflag == '\0') {
              fprintf((FILE *)__stream,"#\n");
            }
            fprintf((FILE *)__stream,"  if (!%strial)\n",symbol_prefix);
            if (lflag == '\0') {
              fprintf((FILE *)__stream,line_format,(ulong)(uint)input_file->lineno,input_file->name)
              ;
            }
          }
          else {
            trialaction = '\x01';
          }
        }
        goto LAB_0011a22e;
      }
    }
    if (tag._4_4_ < 1) {
      fprintf((FILE *)__stream,"\n");
      if (lflag == '\0') {
        fprintf((FILE *)__stream,"#\n");
      }
      fprintf((FILE *)__stream,"break;\n");
      free(line);
      if (0 < rhs._4_4_) {
        free(pcStack_50);
      }
      return;
    }
  }
  else {
    do {
      putc(j,(FILE *)__stream);
      j = (int)cptr[1];
      cptr = cptr + 1;
      ppuVar7 = __ctype_b_loc();
      bVar11 = true;
      if ((((*ppuVar7)[j] & 8) == 0) && (bVar11 = true, j != 0x5f)) {
        bVar11 = j == 0x24;
      }
    } while (bVar11);
  }
  goto LAB_0011a22e;
}

Assistant:

void copy_action()
{
    register int c;
    register int i, j, n;
    int depth;
    int haveyyval = 0;
    char *tag;
    register FILE *f = action_file;
    int a_lineno = input_file->lineno;
    char *a_line = dup_line();
    char *a_cptr = a_line + (cptr - line);
    Yshort *offsets=0, maxoffset;
    bucket **rhs;

    if (last_was_action)
	insert_empty_rule();
    last_was_action = 1;
    trialaction = (*cptr == '[');

    fprintf(f, "case %d:\n", nrules - 2);
    if (!trialaction)
	fprintf(f, "  if (!%strial)\n", symbol_prefix);
    if (!lflag)
	fprintf(f, line_format, input_file->lineno, input_file->name);
    if (*cptr == '=') ++cptr;

    /* FIXME -- the argument offset table is computed independently in
     * FIXME -- several places (compile_arg, copy_action, and can_elide_arg)
     * FIXME -- those multiple implementations should be factored into
     * FIXME -- a single function. */
    maxoffset = n = 0;
    for (i = nitems - 1; pitem[i]; --i) {
	n++;
	if (pitem[i]->class != ARGUMENT)
	    maxoffset++; }
    if (maxoffset > 0) {
	offsets = NEW2(maxoffset+1, Yshort);
	if (offsets == 0) no_space(); }
    for (j=0, i++; i<nitems; i++)
	if (pitem[i]->class != ARGUMENT)
	    offsets[++j] = i - nitems + 1;
    rhs = pitem + nitems - 1;

    depth = 0;
loop:
    c = *cptr;
    if (c == '$') {
	if (cptr[1] == '<') {
	    int d_lineno = input_file->lineno;
	    char *d_line = dup_line();
	    char *d_cptr = d_line + (cptr - line);

	    ++cptr;
	    tag = get_tag(1)->name;
	    c = *cptr;
	    if (c == '$') {
		fprintf(f, "%sval.%s", symbol_prefix, tag);
		++cptr;
		FREE(d_line);
		goto loop; }
	    else if (isdigit(c)) {
		i = get_number();
		if (i > maxoffset) {
		    dollar_warning(d_lineno, i);
		    fprintf(f, "%svsp[%d].%s", symbol_prefix, i - maxoffset, tag); }
		else
		    fprintf(f, "%svsp[%d].%s", symbol_prefix, offsets[i], tag);
		FREE(d_line);
		goto loop; }
	    else if (c == '-' && isdigit(cptr[1])) {
		++cptr;
		i = -get_number() - n;
		fprintf(f, "%svsp[%d].%s", symbol_prefix, i, tag);
		FREE(d_line);
		goto loop; }
	    else if (isalpha(c) || c == '_') {
		char *arg = get_tag(0)->name;
		for (i=plhs[nrules]->args-1; i>=0; i--)
		    if (arg == plhs[nrules]->argnames[i]) break;
		if (i<0)
		    error(d_lineno,d_line,d_cptr,"unknown argument %s",arg);
		fprintf(f, "%svsp[%d].%s", symbol_prefix, i-plhs[nrules]->args+1-n, tag);
		FREE(d_line);
		goto loop; }
	    else
		dollar_error(d_lineno, d_line, d_cptr); }
	else if (cptr[1] == '$') {
	    if (havetags) {
		tag = plhs[nrules]->tag ? plhs[nrules]->tag->name : 0;
		if (tag == 0) untyped_lhs();
		fprintf(f, "%sval.%s", symbol_prefix, tag); }
	    else
		fprintf(f, "%sval", symbol_prefix);
	    cptr += 2;
	    haveyyval = 1;
	    goto loop; }
	else if (isdigit(cptr[1])) {
	    ++cptr;
	    i = get_number();
	    if (havetags) {
		if (i <= 0 || i > maxoffset)
		    unknown_rhs(i);
		tag = rhs[offsets[i]]->tag ? rhs[offsets[i]]->tag->name : 0;
		if (tag == 0)
		    untyped_rhs(i, rhs[offsets[i]]->name);
		fprintf(f, "%svsp[%d].%s", symbol_prefix, offsets[i], tag); }
	    else {
		if (i > n) {
		    dollar_warning(input_file->lineno, i);
		    fprintf(f, "%svsp[%d]", symbol_prefix, i - maxoffset); }
		else
		    fprintf(f, "%svsp[%d]", symbol_prefix, offsets[i]); }
	    goto loop; }
	else if (cptr[1] == '-') {
	    cptr += 2;
	    i = get_number();
	    if (havetags)
		unknown_rhs(-i);
	    fprintf(f, "%svsp[%d]", symbol_prefix, -i - n);
	    goto loop; }
	else if (isalpha(cptr[1]) || cptr[1] == '_') {
	    char *arg;
	    ++cptr;
	    arg = get_tag(0)->name;
	    for (i=plhs[nrules]->args-1; i>=0; i--)
		if (arg == plhs[nrules]->argnames[i]) break;
	    if (i<0)
		error(input_file->lineno, line, cptr, "unknown argument %s", arg);
	    tag = plhs[nrules]->argtags[i];
	    fprintf(f, "%svsp[%d]", symbol_prefix, i - plhs[nrules]->args + 1 - n);
	    if (tag) fprintf(f, ".%s", tag);
	    else if (havetags)
		error(input_file->lineno, 0, 0, "untyped argument $%s", arg);
	    goto loop; }
    } else if (c == '@') {
	if (cptr[1] == '@' || cptr[1] == '$') {
	    fprintf(f, "%spos", symbol_prefix);
	    cptr += 2;
	    goto loop; }
	else if (isdigit(cptr[1])) {
	    ++cptr;
	    i = get_number();
	    if (i > n) {
		at_warning(input_file->lineno, i);
		fprintf(f, "%spsp[%d]", symbol_prefix, i - maxoffset); }
	    else
		fprintf(f, "%spsp[%d]", symbol_prefix, offsets[i]);
	    goto loop; }
	else if (cptr[1] == '-') {
	    cptr += 2;
	    i = get_number();
	    fprintf(f, "%spsp[%d]", symbol_prefix, -i - n);
	    goto loop; } }
    if (isalpha(c) || c == '_' || c == '$') {
	do {
	    putc(c, f);
	    c = *++cptr;
	} while (isalnum(c) || c == '_' || c == '$');
	goto loop; }
    ++cptr;
    if (trialaction && c == '[' && depth == 0) {
	++depth;
	putc('{', f);
	goto loop; }
    if (trialaction && c == ']' && depth == 1) {
	--depth;
	putc('}', f);
	c = nextc();
	if (c == '[' && !haveyyval) {
	    goto loop; }
	else if (c == '{' && !haveyyval) {
	    fprintf(f, "\n");
	    if (!lflag) fprintf(f, "#\n");
	    fprintf(f, "  if (!%strial)\n", symbol_prefix);
	    if (!lflag)
		fprintf(f, line_format, input_file->lineno, input_file->name);
	    trialaction = 0;
	    goto loop; }
	else {
	    fprintf(f, "\n");
	    if (!lflag) fprintf(f, "#\n");
	    fprintf(f, "break;\n");
	    FREE(a_line);
	    if (maxoffset > 0) FREE(offsets);
	    return; } }
    putc(c, f);
    switch (c) {
    case '\n':
	get_line();
	if (line) goto loop;
	unterminated_action(a_lineno, a_line, a_cptr);
    case ';':
	if (depth > 0) goto loop;
	fprintf(f, "\n");
	if (!lflag) fprintf(f, "#\n");
	fprintf(f, "break;\n");
	FREE(a_line);
	if (maxoffset > 0) FREE(offsets);
	return;
    case '[':
	++depth;
	goto loop;
    case ']':
	--depth;
	goto loop;
    case '{':
	++depth;
	goto loop;
    case '}':
	if (--depth > 0) goto loop;
	c = nextc();
	if (c == '[' && !haveyyval) {
	    trialaction = 1;
	    goto loop; }
	else if (c == '{' && !haveyyval) {
	    fprintf(f, "\n");
	    if (!lflag) fprintf(f, "#\n");
	    fprintf(f, "  if (!%strial)\n", symbol_prefix);
	    if (!lflag)
		fprintf(f, line_format, input_file->lineno, input_file->name);
	    goto loop; }
	else {
	    fprintf(f, "\n");
	    if (!lflag) fprintf(f, "#\n");
	    fprintf(f, "break;\n");
	    FREE(a_line);
	    if (maxoffset > 0) FREE(offsets);
	    return; }
    case '\'':
    case '"':
	copy_string(c, f, 0);
	goto loop;
    case '/':
	copy_comment(f, 0);
	goto loop;
    default:
	goto loop; }
}